

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::exit(App *this,int __status)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ostream *in_RCX;
  ostream *in_RDX;
  undefined4 in_register_00000034;
  Error *__args_1;
  string *psVar4;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ostream *local_78;
  string local_70;
  string local_50;
  
  __args_1 = (Error *)CONCAT44(in_register_00000034,__status);
  psVar4 = &__args_1->error_name;
  local_78 = in_RCX;
  ::std::__cxx11::string::string((string *)&local_98,psVar4);
  bVar1 = ::std::operator==(&local_98,"RuntimeError");
  ::std::__cxx11::string::~string((string *)&local_98);
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_98,psVar4);
    bVar1 = ::std::operator==(&local_98,"CallForHelp");
    ::std::__cxx11::string::~string((string *)&local_98);
    if (bVar1) {
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_99);
      help(&local_98,this,&local_50,Normal);
      ::std::operator<<(in_RDX,(string *)&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
      psVar4 = &local_50;
    }
    else {
      ::std::__cxx11::string::string((string *)&local_98,psVar4);
      bVar1 = ::std::operator==(&local_98,"CallForAllHelp");
      ::std::__cxx11::string::~string((string *)&local_98);
      if (!bVar1) {
        ::std::__cxx11::string::string((string *)&local_98,psVar4);
        bVar1 = ::std::operator==(&local_98,"CallForVersion");
        ::std::__cxx11::string::~string((string *)&local_98);
        if (bVar1) {
          pcVar2 = (char *)(**(code **)(*(long *)__args_1 + 0x10))(__args_1);
          poVar3 = ::std::operator<<(in_RDX,pcVar2);
          ::std::operator<<(poVar3,'\n');
          return;
        }
        if (__args_1->actual_exit_code == 0) {
          return;
        }
        if ((this->failure_message_).super__Function_base._M_manager == (_Manager_type)0x0) {
          return;
        }
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
        ::operator()(&local_98,&this->failure_message_,this,__args_1);
        ::std::operator<<(local_78,(string *)&local_98);
        ::std::ostream::flush();
        ::std::__cxx11::string::~string((string *)&local_98);
        return;
      }
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_99);
      help(&local_98,this,&local_70,All);
      ::std::operator<<(in_RDX,(string *)&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
      psVar4 = &local_70;
    }
    ::std::__cxx11::string::~string((string *)psVar4);
  }
  return;
}

Assistant:

CLI11_INLINE int App::exit(const Error &e, std::ostream &out, std::ostream &err) const {

    /// Avoid printing anything if this is a CLI::RuntimeError
    if(e.get_name() == "RuntimeError")
        return e.get_exit_code();

    if(e.get_name() == "CallForHelp") {
        out << help();
        return e.get_exit_code();
    }

    if(e.get_name() == "CallForAllHelp") {
        out << help("", AppFormatMode::All);
        return e.get_exit_code();
    }

    if(e.get_name() == "CallForVersion") {
        out << e.what() << '\n';
        return e.get_exit_code();
    }

    if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
        if(failure_message_)
            err << failure_message_(this, e) << std::flush;
    }

    return e.get_exit_code();
}